

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O3

TVMArgValue __thiscall tvm::runtime::TVMArgs::operator[](TVMArgs *this,int i)

{
  ostream *poVar1;
  TVMArgValue TVar2;
  LogCheckError _check_err;
  LogCheckError local_1b0;
  int local_1a4;
  LogMessageFatal local_1a0;
  
  local_1a4 = this->num_args;
  local_1a0._0_4_ = i;
  dmlc::LogCheck_LT<int,int>((dmlc *)&local_1b0,(int *)&local_1a0,&local_1a4);
  if (local_1b0.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x408);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"i < num_args",0xc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a0,((local_1b0.str)->_M_dataplus)._M_p,
                        (local_1b0.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"not enough argument passed, ",0x1c);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->num_args);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," passed",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," but request arg[",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"].",2);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  dmlc::LogCheckError::~LogCheckError(&local_1b0);
  TVar2.super_TVMPODValue_.type_code_ = this->type_codes[i];
  TVar2.super_TVMPODValue_.value_.v_int64 = this->values[i].v_int64;
  TVar2.super_TVMPODValue_._12_4_ = 0;
  return (TVMArgValue)TVar2.super_TVMPODValue_;
}

Assistant:

inline TVMArgValue TVMArgs::operator[](int i) const {
  CHECK_LT(i, num_args)
      << "not enough argument passed, "
      << num_args << " passed"
      << " but request arg[" << i << "].";
  return TVMArgValue(values[i], type_codes[i]);
}